

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utypes.h
# Opt level: O1

void __thiscall
icu_63::CollationBuilder::makeTailoredCEs(CollationBuilder *this,UErrorCode *errorCode)

{
  CollationRootElements *this_00;
  int64_t *piVar1;
  ulong uVar2;
  uint *puVar3;
  uint32_t *puVar4;
  bool bVar5;
  bool bVar6;
  bool bVar7;
  UBool UVar8;
  uint32_t uVar9;
  long lVar10;
  ulong uVar11;
  uint uVar12;
  uint uVar13;
  uint uVar14;
  int32_t count;
  int iVar15;
  int iVar16;
  uint32_t t;
  ulong uVar17;
  bool bVar18;
  uint uVar19;
  uint uVar20;
  ulong uVar21;
  CollationWeights tertiaries;
  CollationWeights secondaries;
  CollationWeights primaries;
  int32_t local_278;
  ulong local_230;
  long local_228;
  CollationWeights local_21c;
  CollationWeights local_178;
  CollationWeights local_d4;
  
  if (U_ZERO_ERROR < *errorCode) {
    return;
  }
  CollationWeights::CollationWeights(&local_d4);
  CollationWeights::CollationWeights(&local_178);
  CollationWeights::CollationWeights(&local_21c);
  uVar19 = (this->rootPrimaryIndexes).count;
  uVar11 = (ulong)uVar19;
  if (0 < (int)uVar19) {
    piVar1 = (this->nodes).elements;
    this_00 = &this->rootElements;
    local_228 = 0;
    do {
      if ((int)uVar11 < 1) {
        lVar10 = 0;
      }
      else {
        lVar10 = (long)(this->rootPrimaryIndexes).elements[local_228];
      }
      uVar11 = piVar1[lVar10];
      local_230 = uVar11 >> 0x20;
      uVar17 = 0x500;
      if (local_230 == 0) {
        uVar17 = 0;
      }
      local_278 = 0;
      if (local_230 != 0) {
        local_278 = CollationRootElements::findPrimary(this_00,(uint32_t)(uVar11 >> 0x20));
      }
      iVar16 = 0;
      bVar7 = false;
      bVar18 = false;
      bVar5 = false;
      uVar21 = uVar17;
      uVar19 = (uint)(uVar11 >> 8) & 0xfffff;
      while (uVar19 != 0) {
        uVar11 = piVar1[uVar19];
        uVar20 = (uint)(uVar11 >> 8) & 0xfffff;
        uVar9 = (uint32_t)uVar17;
        switch((uint)uVar11 & 3) {
        case 0:
          bVar6 = !bVar7;
          bVar7 = true;
          if (bVar6) {
            iVar15 = 0;
            uVar13 = uVar20;
            do {
              if (uVar13 == 0) break;
              uVar2 = piVar1[uVar13];
              if ((uVar2 & 3) == 0) {
                if ((uVar2 & 8) != 0) {
                  iVar15 = iVar15 + 1;
                  goto LAB_0021e1c3;
                }
                bVar7 = false;
              }
              else {
LAB_0021e1c3:
                uVar13 = (uint)(uVar2 >> 8) & 0xfffff;
                bVar7 = true;
              }
            } while (bVar7);
            UVar8 = this->baseData->compressibleBytes[local_230 >> 0x18];
            uVar9 = CollationRootElements::getPrimaryAfter
                              (this_00,(uint32_t)local_230,local_278,UVar8);
            CollationWeights::initForPrimary(&local_d4,UVar8);
            UVar8 = CollationWeights::allocWeights(&local_d4,(uint32_t)local_230,uVar9,iVar15 + 1);
            if (UVar8 == '\0') {
              *errorCode = U_BUFFER_OVERFLOW_ERROR;
              this->errorReason = "primary tailoring gap too small";
            }
            bVar7 = UVar8 != '\0';
            if (UVar8 == '\0') {
              bVar6 = false;
              goto LAB_0021e5b8;
            }
          }
          uVar9 = CollationWeights::nextWeight(&local_d4);
          local_230 = (ulong)uVar9;
          uVar17 = 0x500;
LAB_0021e30c:
          bVar18 = false;
          break;
        case 1:
          if ((uVar11 & 8) == 0) {
            uVar17 = uVar11 >> 0x30;
            goto LAB_0021e30c;
          }
          bVar6 = !bVar18;
          bVar18 = true;
          if (bVar6) {
            iVar15 = 0;
            uVar13 = uVar20;
            do {
              if (uVar13 == 0) break;
              uVar2 = piVar1[uVar13];
              if ((uVar2 & 3) == 0) {
LAB_0021e3d5:
                bVar18 = false;
              }
              else {
                if (((uint)uVar2 & 3) == 1) {
                  if ((uVar2 & 8) == 0) goto LAB_0021e3d5;
                  iVar15 = iVar15 + 1;
                }
                uVar13 = (uint)uVar2 >> 8 & 0xfffff;
                bVar18 = true;
              }
            } while (bVar18);
            if (uVar9 == 0) {
              puVar4 = (this->rootElements).elements;
              uVar17 = (ulong)((uint)*(byte *)((long)puVar4 + 0x12) * 0x100 - 0x100);
              uVar9 = (uint32_t)*(ushort *)((long)puVar4 + (ulong)puVar4[1] * 4 + 2);
            }
            else if (bVar7) {
              if (uVar9 == 0x100) {
                uVar9 = 0x500;
                uVar17 = 0x100;
              }
              else {
                uVar9 = (uint)*(byte *)((long)(this->rootElements).elements + 0x12) << 8;
              }
            }
            else {
              uVar9 = CollationRootElements::getSecondaryAfter(this_00,local_278,uVar9);
            }
            if ((int)uVar17 == 0x500) {
              uVar17 = (ulong)*(byte *)((long)(this->rootElements).elements + 0x13) << 8;
            }
            CollationWeights::initForSecondary(&local_178);
            UVar8 = CollationWeights::allocWeights(&local_178,(uint32_t)uVar17,uVar9,iVar15 + 1);
            if (UVar8 == '\0') {
              *errorCode = U_BUFFER_OVERFLOW_ERROR;
              this->errorReason = "secondary tailoring gap too small";
            }
            bVar18 = UVar8 != '\0';
            if (UVar8 == '\0') {
              bVar6 = false;
              goto LAB_0021e5b8;
            }
          }
          uVar9 = CollationWeights::nextWeight(&local_178);
          uVar17 = (ulong)uVar9;
          break;
        case 2:
          if ((uVar11 & 8) == 0) {
            uVar21 = uVar11 >> 0x30;
            goto LAB_0021e58a;
          }
          if (!bVar5) {
            iVar15 = 0;
            uVar13 = uVar20;
            do {
              if (uVar13 == 0) break;
              uVar12 = (uint)piVar1[uVar13];
              uVar14 = uVar12 & 3;
              if (uVar14 < 2) {
LAB_0021e33e:
                bVar5 = false;
              }
              else {
                if (uVar14 == 2) {
                  if ((piVar1[uVar13] & 8U) == 0) goto LAB_0021e33e;
                  iVar15 = iVar15 + 1;
                }
                uVar13 = uVar12 >> 8 & 0xfffff;
                bVar5 = true;
              }
            } while (bVar5);
            t = (uint32_t)uVar21;
            if (t == 0) {
              puVar3 = (this->rootElements).elements;
              uVar21 = (ulong)((puVar3[4] & 0xff) * 0x100 - 0x100);
              uVar9 = puVar3[*puVar3] & 0x3f3f;
            }
            else if (bVar7 || bVar18) {
              if (t == 0x100) {
                uVar9 = 0x500;
                uVar21 = 0x100;
              }
              else {
                uVar9 = ((this->rootElements).elements[4] & 0xff) << 8;
              }
            }
            else {
              uVar9 = CollationRootElements::getTertiaryAfter(this_00,local_278,uVar9,t);
            }
            CollationWeights::initForTertiary(&local_21c);
            UVar8 = CollationWeights::allocWeights(&local_21c,(uint32_t)uVar21,uVar9,iVar15 + 1);
            if (UVar8 == '\0') {
              *errorCode = U_BUFFER_OVERFLOW_ERROR;
              this->errorReason = "tertiary tailoring gap too small";
              bVar5 = false;
              bVar6 = false;
              goto LAB_0021e5b8;
            }
          }
          bVar5 = true;
          uVar9 = CollationWeights::nextWeight(&local_21c);
          uVar21 = (ulong)uVar9;
          iVar16 = 0;
          goto LAB_0021e58f;
        case 3:
          if (iVar16 != 3) {
            iVar16 = iVar16 + 1;
            goto LAB_0021e58f;
          }
          *errorCode = U_BUFFER_OVERFLOW_ERROR;
          this->errorReason = "quaternary tailoring gap too small";
          iVar16 = 3;
          bVar6 = false;
          goto LAB_0021e5b8;
        }
        uVar21 = 0x500;
        if ((int)uVar17 == 0) {
          uVar21 = uVar17;
        }
LAB_0021e58a:
        iVar16 = 0;
        bVar5 = false;
LAB_0021e58f:
        bVar6 = true;
        if ((uVar11 & 8) != 0) {
          piVar1[uVar19] =
               (ulong)(iVar16 << 6 | (uint)uVar21) |
               (ulong)(uint)((int)uVar17 << 0x10) | local_230 << 0x20;
        }
LAB_0021e5b8:
        uVar19 = uVar20;
        if (!bVar6) {
          return;
        }
      }
      local_228 = local_228 + 1;
      uVar11 = (ulong)(this->rootPrimaryIndexes).count;
    } while (local_228 < (long)uVar11);
  }
  return;
}

Assistant:

static
    inline UBool U_FAILURE(UErrorCode code) { return (UBool)(code>U_ZERO_ERROR); }